

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFileFormat.cpp
# Opt level: O2

void __thiscall
RegionFileFormat::saveRegion
          (RegionFileFormat *this,Board *board,RegionCoords *regionCoords,Region *region)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  char cVar3;
  path *ppVar4;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var5;
  mapped_type *pmVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  size_type sVar9;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_01;
  runtime_error *prVar10;
  uint uVar11;
  pair<int,_int> pVar12;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  uint uVar15;
  istream *in_R8;
  path *in_R9;
  ulong uVar16;
  bool bVar17;
  format_string_t<const_int_&,_const_int_&> fmt;
  format_string_t<long_&> fmt_00;
  format_string_t<std::pair<int,_int>,_const_unsigned_int_&,_const_unsigned_int_&> fmt_01;
  format_string_t<std::pair<int,_int>_> fmt_02;
  format_string_t<std::pair<int,_int>,_unsigned_long> fmt_03;
  format_string_t<std::pair<int,_int>_> fmt_04;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_bool>
  pVar18;
  streamsize regionFileLength;
  uint local_1494;
  RegionFileFormat *local_1490;
  uint32_t sectorCount;
  int iStack_1484;
  RegionCoords *local_1468;
  Board *local_1460;
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  serializedChunks;
  uint32_t currentSectors;
  int iStack_1424;
  uint32_t lastOffset;
  path regionFilename;
  string local_13c8;
  string local_13a8;
  string local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1368;
  char emptySector [256];
  fstream regionFile;
  ChunkHeader header [1024];
  
  local_1490 = this;
  local_1460 = board;
  std::__cxx11::to_string((string *)&serializedChunks,regionCoords->first);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)emptySector,
                 (string *)&serializedChunks,".");
  std::__cxx11::to_string((string *)&sectorCount,regionCoords->second);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regionFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)emptySector,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sectorCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)header,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regionFile,
                 ".dat");
  ghc::filesystem::path::path(&regionFilename,(string_type *)header,auto_format);
  std::__cxx11::string::~string((string *)header);
  std::__cxx11::string::~string((string *)&regionFile);
  std::__cxx11::string::~string((string *)&sectorCount);
  std::__cxx11::string::~string((string *)emptySector);
  std::__cxx11::string::~string((string *)&serializedChunks);
  ppVar4 = FileStorage::getFilename(&local_1490->super_FileStorage);
  ghc::filesystem::path::path<char[7],ghc::filesystem::path>
            ((path *)emptySector,(char (*) [7])"region",auto_format);
  ghc::filesystem::operator/((path *)&regionFile,ppVar4,(path *)emptySector);
  ghc::filesystem::operator/((path *)header,(path *)&regionFile,&regionFilename);
  ghc::filesystem::path::operator=(&regionFilename,(path *)header);
  ghc::filesystem::path::~path((path *)header);
  ghc::filesystem::path::~path((path *)&regionFile);
  ghc::filesystem::path::~path((path *)emptySector);
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
            (&regionFile,&regionFilename,_S_out|_S_in|_S_bin);
  fmt.str.size_ = (size_t)regionCoords;
  fmt.str.data_ = (char *)0x20;
  spdlog::debug<int_const&,int_const&>
            ((spdlog *)"Saving chunks for region {}, {}.",fmt,&regionCoords->second,(int *)in_R8);
  memset(header,0,0x1000);
  regionFileLength = 0;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              (&regionFile,(char *)&regionFilename,0x14);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_((string *)&sectorCount,&regionFilename);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sectorCount);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     emptySector,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks,"\": unable to open file for writing.");
      std::runtime_error::runtime_error(prVar10,(string *)emptySector);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::istream::ignore((long)&regionFile);
    regionFileLength = regionFile.super_basic_fstream<char,_std::char_traits<char>_>._8_8_;
    std::ios::clear((int)&regionFile +
                    (int)*(undefined8 *)
                          (regionFile.super_basic_fstream<char,_std::char_traits<char>_>._0_8_ +
                          -0x18));
    std::istream::seekg((long)&regionFile,_S_beg);
    if (regionFileLength < 0x1000) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_1388,&regionFilename);
      std::operator+(&local_1368,"\"",&local_1388);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &lastOffset,&local_1368,"\": binary file with ");
      std::__cxx11::to_string(&local_13a8,regionFileLength);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentSectors,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &lastOffset,&local_13a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sectorCount,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentSectors," bytes is less than minimum size of ");
      std::__cxx11::to_string(&local_13c8,0x1000);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sectorCount,&local_13c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     emptySector,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks," bytes.");
      std::runtime_error::runtime_error(prVar10,(string *)emptySector);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)regionFileLength != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_1388,&regionFilename);
      std::operator+(&local_1368,"\"",&local_1388);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &lastOffset,&local_1368,"\": binary file with ");
      std::__cxx11::to_string(&local_13a8,regionFileLength);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentSectors,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &lastOffset,&local_13a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sectorCount,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentSectors," bytes is not evenly divisible by ");
      std::__cxx11::to_string(&local_13c8,0x100);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sectorCount,&local_13c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     emptySector,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializedChunks," byte sectors.");
      std::runtime_error::runtime_error(prVar10,(string *)emptySector);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppVar4 = (path *)0x29;
    fmt_00.str.size_ = (size_t)&regionFileLength;
    fmt_00.str.data_ = (char *)0x29;
    spdlog::debug<long&>
              ((spdlog *)"Found existing region file with {} bytes.",fmt_00,
               (long *)regionFile.super_basic_fstream<char,_std::char_traits<char>_>._8_8_);
    readRegionHeader(header,ppVar4,(istream *)&regionFile);
  }
  std::ostream::seekp((long)&regionFile.super_basic_fstream<char,_std::char_traits<char>_>.
                             field_0x10,_S_beg);
  serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header;
  serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  serializedChunks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (region->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1494 = 0;
  local_1468 = regionCoords;
  serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(region->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var14 = (_Rb_tree_node_base *)0x0;
      memset(emptySector,0,0x100);
      lastOffset = 0x10;
      if ((local_1494 & 1) == 0) {
        if (regionFileLength == 0) {
          iVar13 = 0x10;
          while (bVar17 = iVar13 != 0, iVar13 = iVar13 + -1, bVar17) {
            p_Var14 = (_Rb_tree_node_base *)emptySector;
            std::ostream::write(&regionFile.super_basic_fstream<char,_std::char_traits<char>_>.
                                 field_0x10,(long)emptySector);
          }
        }
        else {
          lastOffset = (uint32_t)(regionFileLength / 0x100);
        }
      }
      else {
        spdlog::debug<char[39]>((char (*) [39])"Preparing all chunks for reallocation.");
        for (uVar16 = 0; uVar16 != 0x400; uVar16 = uVar16 + 1) {
          pVar12 = (pair<int,_int>)
                   (CONCAT44((uint)(uVar16 >> 5) & 0x7ffffff | 0x80000000 | local_1468->second << 5,
                             local_1468->first << 5 | (uint)uVar16 & 0x1f) | 0x80000000);
          _currentSectors = pVar12;
          if (0xffffff < (uint)header[uVar16]) {
            p_Var14 = (_Rb_tree_node_base *)&currentSectors;
            sVar9 = std::
                    map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
                    ::count(&serializedChunks,(key_type *)&currentSectors);
            if (sVar9 == 0) {
              in_R8 = (istream *)&regionFile;
              readChunk((vector<char,_std::allocator<char>_> *)&sectorCount,header,(uint)uVar16,
                        (path *)pVar12,in_R8);
              p_Var14 = (_Rb_tree_node_base *)&currentSectors;
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
              ::_M_emplace_unique<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
                          *)&serializedChunks,(unsigned_long *)&currentSectors,
                         (vector<char,_std::allocator<char>_> *)&sectorCount);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&sectorCount);
            }
          }
          header[uVar16] = (ChunkHeader)0x0;
        }
      }
      local_1490 = (RegionFileFormat *)&local_1490->savedRegions_;
      for (p_Var8 = serializedChunks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &serializedChunks._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        p_Var14 = p_Var8 + 1;
        pVar12 = (pair<int,_int>)((long)p_Var8[1]._M_left - (long)p_Var8[1]._M_parent);
        if (pVar12 == (pair<int,_int>)0x0) {
          this_00 = &std::
                     map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                     ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                   *)local_1490,local_1468)->_M_t;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::erase(this_00,(key_type *)p_Var14);
        }
        else {
          uVar16 = *(ulong *)(p_Var8 + 1);
          if (pVar12.first - 0xfefdU < 0xffff00ff) {
            _sectorCount = (pair<int,_int>)(uVar16 ^ 0x8000000080000000);
            p_Var14 = (_Rb_tree_node_base *)0x34;
            fmt_03.str.size_ = (size_t)&sectorCount;
            fmt_03.str.data_ = (char *)0x34;
            _currentSectors = pVar12;
            spdlog::error<std::pair<int,int>,unsigned_long>
                      ((spdlog *)"Failed to save chunk at {} (serialized to {} bytes).",fmt_03,
                       (pair<int,_int> *)&currentSectors,(unsigned_long *)in_R8);
          }
          else {
            this_01 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                       *)std::
                         map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                         ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                       *)local_1490,local_1468);
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>(this_01,(unsigned_long *)p_Var14);
            _sectorCount = (pair<int,_int>)(*(ulong *)p_Var14 ^ 0x8000000080000000);
            fmt_04.str.size_ = (size_t)&sectorCount;
            fmt_04.str.data_ = (char *)0x11;
            spdlog::debug<std::pair<int,int>>
                      ((spdlog *)"Writing chunk {}.",fmt_04,(pair<int,_int> *)0x8000000080000000);
            p_Var5 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)Board::getLoadedChunks(local_1460);
            pmVar6 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at(p_Var5,(key_type *)p_Var14);
            Chunk::debugPrintChunk(pmVar6);
            uVar16 = uVar16 & 0x1f0000001f;
            in_R8 = (istream *)&p_Var8[1]._M_parent;
            writeChunk(header,(uint)(uVar16 >> 0x1b) | (uint)uVar16,emptySector,&lastOffset,
                       (vector<char,_std::allocator<char>_> *)in_R8,in_R9,
                       (ostream *)
                       &regionFile.super_basic_fstream<char,_std::char_traits<char>_>.field_0x10);
            p_Var5 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)Board::getLoadedChunks(local_1460);
            pmVar6 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at(p_Var5,(key_type *)p_Var14);
            Chunk::markAsSaved(pmVar6);
          }
        }
      }
      writeRegionHeader(header,(path *)p_Var14,
                        (ostream *)
                        &regionFile.super_basic_fstream<char,_std::char_traits<char>_>.field_0x10);
      std::fstream::close();
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&serializedChunks._M_t);
      ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::~basic_fstream(&regionFile);
      ghc::filesystem::path::~path(&regionFilename);
      return;
    }
    p_Var5 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)Board::getLoadedChunks(local_1460);
    p_Var14 = p_Var8 + 1;
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(p_Var5,(key_type *)p_Var14);
    Chunk::serialize((vector<char,_std::allocator<char>_> *)emptySector,pmVar6);
    pVar18 = std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
             ::_M_emplace_unique<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                       ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
                         *)&serializedChunks,(unsigned_long *)p_Var14,
                        (vector<char,_std::allocator<char>_> *)emptySector);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)emptySector);
    if (0 < regionFileLength) {
      uVar16 = *(ulong *)p_Var14;
      p_Var1 = pVar18.first._M_node._M_node[1]._M_parent;
      p_Var2 = pVar18.first._M_node._M_node[1]._M_left;
      uVar11 = ((int)p_Var2 - (int)p_Var1) + 0x103U >> 8;
      sectorCount = uVar11;
      in_R8 = (istream *)(ulong)((uint)uVar16 & 0x1f | (uint)(uVar16 >> 0x1b) & 0x3e0);
      if (0xffffff < (uint)header[(long)in_R8]) {
        if (p_Var1 == p_Var2) {
          emptySector._0_8_ = uVar16 ^ 0x8000000080000000;
          fmt_02.str.size_ = (size_t)emptySector;
          fmt_02.str.data_ = (char *)0x26;
          spdlog::debug<std::pair<int,int>>
                    ((spdlog *)"Chunk {} requires 0 sectors, removing.",fmt_02,
                     (pair<int,_int> *)0x8000000080000000);
          uVar7 = extraout_RAX_00;
        }
        else {
          uVar15 = (uint)header[(long)in_R8] >> 0x18;
          if (uVar11 <= uVar15) goto LAB_001611cc;
          currentSectors = uVar15;
          emptySector._0_8_ = uVar16 ^ 0x8000000080000000;
          in_R8 = (istream *)&currentSectors;
          fmt_01.str.size_ = (size_t)emptySector;
          fmt_01.str.data_ = (char *)0x37;
          spdlog::debug<std::pair<int,int>,unsigned_int_const&,unsigned_int_const&>
                    ((spdlog *)"Chunk {} requires {} sectors but only {} are allocated.",fmt_01,
                     (pair<int,_int> *)&sectorCount,(uint *)in_R8,(uint *)in_R9);
          uVar7 = extraout_RAX;
        }
        local_1494 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
    }
LAB_001611cc:
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void RegionFileFormat::saveRegion(Board& board, const RegionCoords& regionCoords, const Region& region) {
    fs::path regionFilename = std::to_string(regionCoords.first) + "." + std::to_string(regionCoords.second) + ".dat";
    regionFilename = getFilename() / "region" / regionFilename;
    fs::fstream regionFile(regionFilename, std::ios::in | std::ios::out | std::ios::binary);
    spdlog::debug("Saving chunks for region {}, {}.", regionCoords.first, regionCoords.second);

    ChunkHeader header[REGION_WIDTH * REGION_WIDTH] = {};
    std::streamsize regionFileLength = 0;
    if (regionFile.is_open()) {
        // Determine number of bytes we can read from the file, should match the file size in most cases.
        // https://stackoverflow.com/questions/22984956/tellg-function-give-wrong-size-of-file/22986486#22986486
        regionFile.ignore(std::numeric_limits<std::streamsize>::max());
        regionFileLength = regionFile.gcount();
        regionFile.clear();
        regionFile.seekg(0, std::ios::beg);
        if (regionFileLength < 4 * REGION_WIDTH * REGION_WIDTH) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is less than minimum size of " + std::to_string(4 * REGION_WIDTH * REGION_WIDTH) + " bytes."
            );
        }
        if (regionFileLength % SECTOR_SIZE != 0) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is not evenly divisible by " + std::to_string(SECTOR_SIZE) + " byte sectors."
            );
        }

        spdlog::debug("Found existing region file with {} bytes.", regionFileLength);
        readRegionHeader(header, regionFilename, regionFile);
    } else {
        regionFile.open(regionFilename, std::ios::out | std::ios::binary);
        if (!regionFile.is_open()) {
            throw std::runtime_error("\"" + regionFilename.string() + "\": unable to open file for writing.");
        }
    }
    regionFile.seekp(0, std::ios::beg);

    bool reallocationRequired = false;
    std::map<ChunkCoords::repr, std::vector<char>> serializedChunks;
    for (const auto& chunkCoords : region) {
        const auto serialized = serializedChunks.emplace(chunkCoords, board.getLoadedChunks().at(chunkCoords).serialize()).first;
        if (regionFileLength > 0) {
            const auto regionOffset = toRegionOffset(chunkCoords);
            const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
            const uint32_t serializedSize = static_cast<uint32_t>(serialized->second.size() + sizeof(serializedSize));
            const uint32_t sectorCount = (serializedSize + SECTOR_SIZE - 1) / SECTOR_SIZE;
            if (header[headerIndex].sectors > 0) {
                if (serialized->second.empty()) {
                    spdlog::debug("Chunk {} requires 0 sectors, removing.", ChunkCoords::toPair(chunkCoords));
                    reallocationRequired = true;
                } else if (header[headerIndex].sectors < sectorCount) {
                    const uint32_t currentSectors = header[headerIndex].sectors;
                    spdlog::debug("Chunk {} requires {} sectors but only {} are allocated.", ChunkCoords::toPair(chunkCoords), sectorCount, currentSectors);
                    reallocationRequired = true;
                }
            }
        }
    }

    const char emptySector[SECTOR_SIZE] = {};
    uint32_t lastOffset = 4 * REGION_WIDTH * REGION_WIDTH / SECTOR_SIZE;
    if (reallocationRequired) {
        // Read in all chunks and wipe header.
        spdlog::debug("Preparing all chunks for reallocation.");
        for (int i = 0; i < REGION_WIDTH * REGION_WIDTH; ++i) {
            const auto chunkCoords = ChunkCoords::pack(i % REGION_WIDTH + regionCoords.first * REGION_WIDTH, i / REGION_WIDTH + regionCoords.second * REGION_WIDTH);
            if (header[i].sectors > 0 && serializedChunks.count(chunkCoords) == 0) {
                serializedChunks.emplace(
                    chunkCoords,
                    readChunk(header, i, regionFilename, regionFile)
                );
            }
            header[i].offset = 0;
            header[i].sectors = 0;
        }
    } else if (regionFileLength == 0) {
        // Write empty header.
        for (uint32_t i = 0; i < lastOffset; ++i) {
            regionFile.write(emptySector, SECTOR_SIZE);
        }
    } else {
        lastOffset = static_cast<uint32_t>(regionFileLength / SECTOR_SIZE);
    }

    // Write chunks.
    for (const auto& serialized : serializedChunks) {
        const auto regionOffset = toRegionOffset(serialized.first);
        const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
        const uint32_t serializedSize = static_cast<uint32_t>(serialized.second.size() + sizeof(serializedSize));
        if (serialized.second.empty()) {
            savedRegions_[regionCoords].erase(serialized.first);
            continue;
        } else if (serializedSize <= std::numeric_limits<uint8_t>::max() * static_cast<uint32_t>(SECTOR_SIZE)) {
            savedRegions_[regionCoords].insert(serialized.first);
        } else {
            // FIXME unable to save this chunk, too much data
            // FIXME this check should be moved into writeChunk().
            spdlog::error("Failed to save chunk at {} (serialized to {} bytes).", ChunkCoords::toPair(serialized.first), serialized.second.size());
            continue;
        }

        spdlog::debug("Writing chunk {}.", ChunkCoords::toPair(serialized.first));
        board.getLoadedChunks().at(serialized.first).debugPrintChunk();
        writeChunk(header, headerIndex, emptySector, lastOffset, serialized.second, regionFilename, regionFile);
        board.getLoadedChunks().at(serialized.first).markAsSaved();
    }

    // Write (filled) header.
    writeRegionHeader(header, regionFilename, regionFile);

    // FIXME make a check if the regionFileLength is greater than length from lastOffset to determine if we need to
    // truncate the file with fs::resize_file

    regionFile.close();

    // FIXME need to clean up empty chunks (or should we do this after all regions have been saved?).


}